

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

void GraphTask::run(search *sch,multi_ex *ec)

{
  uint32_t uVar1;
  uint n_00;
  ptag tag;
  task_data *D;
  example *peVar2;
  wclass *pwVar3;
  pointer pvVar4;
  bool bVar5;
  action aVar6;
  size_t n;
  ulong uVar7;
  ulong uVar8;
  stringstream *psVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t j;
  ulong uVar15;
  predictor *ppVar16;
  ulong n_01;
  size_t i;
  ulong uVar17;
  float fVar18;
  float local_158;
  predictor P;
  
  D = (task_data *)sch->task_data;
  uVar8 = D->num_loops;
  for (uVar7 = 0; uVar7 < D->N; uVar7 = uVar7 + 1) {
    (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = D->K + 1;
  }
  for (uVar7 = 0; uVar7 < D->num_loops; uVar7 = uVar7 + 1) {
    local_158 = 0.5;
    if (uVar7 != D->num_loops - 1) {
      local_158 = 0.5 / (float)uVar8;
    }
    uVar1 = D->N;
    uVar12 = (ulong)((uint)uVar7 & 1);
    uVar13 = -uVar12;
    for (uVar11 = (long)(int)(uVar1 - 1) & uVar13;
        uVar11 != (-(ulong)(uVar12 != 0) | (long)(int)uVar1); uVar11 = uVar11 + (uVar13 | 1)) {
      n_00 = (D->bfs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
      n_01 = (ulong)n_00;
      peVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n_01];
      pwVar3 = (peVar2->l).cs.costs._begin;
      if ((peVar2->l).cs.costs._end == pwVar3) {
        aVar6 = 0;
      }
      else {
        aVar6 = pwVar3->class_index;
      }
      bVar5 = Search::search::predictNeedsExample(sch);
      if (bVar5) {
        add_edge_features(sch,D,n_01,ec);
      }
      Search::predictor::predictor(&P,sch,n_00 + 1);
      Search::predictor::set_input
                (&P,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[n_01]);
      if (D->separate_learners == true) {
        Search::predictor::set_learner_id(&P,uVar7);
      }
      if (aVar6 != 0) {
        Search::predictor::set_oracle(&P,aVar6);
      }
      for (uVar17 = 0;
          pvVar4 = (D->adj).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar17 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar4[n_01].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar4[n_01].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data >> 3); uVar17 = uVar17 + 1) {
        lVar14 = 4;
        for (uVar15 = 0;
            peVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar17], pwVar3 = (peVar2->l).cs.costs._begin,
            uVar15 < (ulong)((long)(peVar2->l).cs.costs._end - (long)pwVar3 >> 4);
            uVar15 = uVar15 + 1) {
          tag = *(ptag *)((long)&pwVar3->x + lVar14);
          if ((tag != 0) && (tag - 1 != n_00)) {
            Search::predictor::add_condition(&P,tag,'e');
          }
          lVar14 = lVar14 + 0x10;
        }
      }
      ppVar16 = &P;
      aVar6 = Search::predictor::predict(&P);
      (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[n_01] = (ulong)aVar6;
      peVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n_01];
      pwVar3 = (peVar2->l).cs.costs._begin;
      if ((peVar2->l).cs.costs._end != pwVar3) {
        fVar18 = 0.0;
        if ((D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[n_01] != (ulong)pwVar3->class_index) {
          fVar18 = local_158;
        }
        ppVar16 = (predictor *)sch;
        Search::search::loss(sch,fVar18);
      }
      if (bVar5) {
        del_edge_features((task_data *)ppVar16,n_00,ec);
      }
      Search::predictor::~predictor(&P);
    }
  }
  for (uVar8 = 0; uVar8 < D->N; uVar8 = uVar8 + 1) {
    D->confusion_matrix
    [(D->K + 1) *
     (ulong)(((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8]->l).cs.costs._begin)->class_index +
     (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start[uVar8]] =
         D->confusion_matrix
         [(D->K + 1) *
          (ulong)(((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8]->l).cs.costs._begin)->class_index +
          (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8]] + 1;
  }
  fVar18 = macro_f(D);
  Search::search::loss(sch,1.0 - fVar18);
  psVar9 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar9 + *(long *)(*(long *)psVar9 + -0x18) + 0x20) == 0) {
    for (uVar8 = 0; uVar8 < D->N; uVar8 = uVar8 + 1) {
      psVar9 = Search::search::output_abi_cxx11_(sch);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar9 + 0x10));
      std::operator<<(poVar10,' ');
    }
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  float loss_val = 0.5f / (float)D.num_loops;
  for (size_t n = 0; n < D.N; n++) D.pred[n] = D.K + 1;

  for (size_t loop = 0; loop < D.num_loops; loop++)
  {
    bool last_loop = loop == (D.num_loops - 1);
    int start = 0;
    int end = D.N;
    int step = 1;
    if (loop % 2 == 1)
    {
      start = D.N - 1;
      end = -1;
      step = -1;
    }  // go inward on odd loops
    for (int n_id = start; n_id != end; n_id += step)
    {
      uint32_t n = D.bfs[n_id];
      uint32_t k = (ec[n]->l.cs.costs.size() > 0) ? ec[n]->l.cs.costs[0].class_index : 0;

      bool add_features = /* D.use_structure && */ sch.predictNeedsExample();
      // add_features = false;

      if (add_features)
        add_edge_features(sch, D, n, ec);
      Search::predictor P = Search::predictor(sch, n + 1);
      P.set_input(*ec[n]);
      if (false && (k > 0))
      {
        float min_count = 1e12f;
        for (size_t k2 = 1; k2 <= D.K; k2++) min_count = min(min_count, D.true_counts[k2]);
        float w = min_count / D.true_counts[k];
        // float w = D.true_counts_total / D.true_counts[k] / (float)(D.K);
        P.set_weight(w);
        // cerr << "w = " << D.true_counts_total / D.true_counts[k] / (float)(D.K) << endl;
        // P.set_weight( D.true_counts_total / D.true_counts[k] / (float)(D.K) );
      }
      if (D.separate_learners)
        P.set_learner_id(loop);
      if (k > 0)  // for test examples
        P.set_oracle(k);
      // add all the conditioning
      for (size_t i = 0; i < D.adj[n].size(); i++)
      {
        for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            continue;
          m--;
          if (m == n)
            continue;
          P.add_condition(m + 1, 'e');
        }
      }

      // make the prediction
      D.pred[n] = P.predict();
      if (ec[n]->l.cs.costs.size() > 0)  // for test examples
        sch.loss((ec[n]->l.cs.costs[0].class_index == D.pred[n]) ? 0.f : (last_loop ? 0.5f : loss_val));

      if (add_features)
        del_edge_features(D, n, ec);
    }
  }

  for (uint32_t n = 0; n < D.N; n++) D.confusion_matrix[IDX(ec[n]->l.cs.costs[0].class_index, D.pred[n])]++;
  sch.loss(1.f - macro_f(D));

  if (sch.output().good())
    for (uint32_t n = 0; n < D.N; n++) sch.output() << D.pred[n] << ' ';
}